

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

size_t write_lab(MIR_context_t ctx,writer_func_t writer,MIR_label_t lab)

{
  size_t *psVar1;
  uint uVar2;
  ulong u;
  reduce_data *data;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  uint32_t uVar6;
  uint8_t uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  if (writer == (writer_func_t)0x0) {
    sVar5 = 0;
  }
  else {
    u = lab->ops[0].u.u;
    if (u < 0x80) {
      lVar10 = 0;
    }
    else {
      uVar4 = u;
      uVar9 = 0xffffffffffffffff;
      do {
        uVar8 = uVar9;
        uVar9 = uVar8 + 1;
        bVar3 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar3);
      if (3 < uVar9) {
        __assert_fail("nb <= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x12db,"size_t write_lab(MIR_context_t, writer_func_t, MIR_label_t)");
      }
      lVar10 = uVar8 + 2;
    }
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    uVar7 = (char)lVar10 + '\x1f';
    data = ctx->io_ctx->io_reduce_data;
    uVar2 = data->buf_bound;
    if ((ulong)uVar2 < 0x40000) {
      uVar6 = uVar2 + 1;
      data->buf[uVar2] = uVar7;
    }
    else {
      _reduce_encode_buf(data);
      uVar6 = 1;
      data->buf[0] = uVar7;
    }
    data->buf_bound = uVar6;
    sVar5 = put_uint(ctx,writer,u,(int)lVar10);
    sVar5 = sVar5 + 1;
    psVar1 = &ctx->io_ctx->output_labs_len;
    *psVar1 = *psVar1 + sVar5;
  }
  return sVar5;
}

Assistant:

static size_t write_lab (MIR_context_t ctx, writer_func_t writer, MIR_label_t lab) {
  size_t nb, len;
  uint64_t lab_num;

  if (writer == NULL) return 0;
  lab_num = lab->ops[0].u.u;
  nb = uint_length (lab_num);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, TAG_LAB1 + (int) nb - 1);
  len = put_uint (ctx, writer, lab_num, (int) nb) + 1;
  output_labs_len += len;
  return len;
}